

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O3

int scan_modifiers(uint8_t *p,uint len)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t __n;
  int bot;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = 0x4c;
  iVar5 = 0;
  do {
    iVar4 = (iVar5 + iVar3) / 2;
    __s = modlist[iVar4].name;
    sVar2 = strlen(__s);
    __n = (size_t)len;
    if ((uint)sVar2 < len) {
      __n = sVar2 & 0xffffffff;
    }
    iVar1 = strncmp((char *)p,__s,__n);
    if ((iVar1 == 0) && (iVar1 = len - (uint)sVar2, iVar1 == 0)) {
      return iVar4;
    }
    if (0 < iVar1) {
      iVar5 = iVar4 + 1;
      iVar4 = iVar3;
    }
    iVar3 = iVar4;
  } while (iVar5 < iVar3);
  return -1;
}

Assistant:

static int
scan_modifiers(const uint8_t *p, unsigned int len)
{
int bot = 0;
int top = MODLISTCOUNT;

while (top > bot)
  {
  int mid = (bot + top)/2;
  unsigned int mlen = strlen(modlist[mid].name);
  int c = strncmp((char *)p, modlist[mid].name, (len < mlen)? len : mlen);
  if (c == 0)
    {
    if (len == mlen) return mid;
    c = len - mlen;
    }
  if (c > 0) bot = mid + 1; else top = mid;
  }

return -1;

}